

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFMatrix.cc
# Opt level: O2

void __thiscall QPDFMatrix::concat(QPDFMatrix *this,QPDFMatrix *other)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  dVar2 = other->a;
  dVar3 = other->b;
  dVar4 = other->c;
  dVar5 = other->d;
  dVar6 = other->e;
  dVar1 = other->f;
  dVar7 = this->a;
  dVar8 = this->b;
  dVar9 = this->c;
  dVar10 = this->d;
  this->a = dVar2 * dVar7 + dVar3 * dVar9;
  this->b = dVar2 * dVar8 + dVar3 * dVar10;
  this->c = dVar4 * dVar7 + dVar5 * dVar9;
  this->d = dVar4 * dVar8 + dVar5 * dVar10;
  this->e = dVar6 * dVar7 + dVar1 * dVar9 + this->e;
  this->f = dVar6 * dVar8 + dVar1 * dVar10 + this->f;
  return;
}

Assistant:

void
QPDFMatrix::concat(QPDFMatrix const& other)
{
    double ap = (this->a * other.a) + (this->c * other.b);
    double bp = (this->b * other.a) + (this->d * other.b);
    double cp = (this->a * other.c) + (this->c * other.d);
    double dp = (this->b * other.c) + (this->d * other.d);
    double ep = (this->a * other.e) + (this->c * other.f) + this->e;
    double fp = (this->b * other.e) + (this->d * other.f) + this->f;
    this->a = ap;
    this->b = bp;
    this->c = cp;
    this->d = dp;
    this->e = ep;
    this->f = fp;
}